

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O3

wchar_t assertion_entry_compare_acls
                  (char *file,wchar_t line,archive_entry *ae,archive_test_acl_t *acls,wchar_t cnt,
                  wchar_t want_type,wchar_t mode)

{
  char cVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  int iVar6;
  mode_t mVar7;
  ulong uVar8;
  archive_test_acl_t *paVar9;
  char *pcVar10;
  ulong uVar11;
  int *piVar12;
  ulong uVar13;
  uint uVar14;
  wchar_t local_98;
  wchar_t permset;
  ulong local_80;
  archive_entry *local_78;
  wchar_t local_70;
  wchar_t qual;
  int *local_68;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  wchar_t local_4c;
  wchar_t tag;
  wchar_t type;
  char *name;
  char *local_38;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  local_68 = (int *)malloc((long)cnt * 4);
  if (L'\0' < cnt) {
    uVar8 = 0;
    uVar11 = 0;
    paVar9 = acls;
    do {
      if ((paVar9->type & want_type) != 0) {
        local_68[(int)uVar11] = (int)uVar8;
        uVar11 = (ulong)((int)uVar11 + 1);
      }
      uVar8 = uVar8 + 1;
      paVar9 = paVar9 + 1;
    } while ((uint)cnt != uVar8);
    if ((int)uVar11 != 0) {
      local_70 = mode & 7;
      local_58 = mode & 0x38;
      local_60 = (uint)mode >> 3 & 7;
      local_54 = mode & 0x1c0;
      local_5c = (uint)mode >> 6 & 7;
      local_98 = L'\0';
      local_78 = ae;
LAB_001183ed:
      do {
        wVar5 = archive_entry_acl_next(ae,want_type,&type,&permset,&tag,&qual,&name);
        wVar4 = type;
        wVar3 = tag;
        wVar2 = permset;
        if (wVar5 != L'\0') {
          if (wVar5 != L'\x01') {
            failure_start(file,line,"Should not exit before EOF");
            failure_finish((void *)0x0);
            local_98 = L'\x01';
          }
          if ((((uint)want_type >> 8 & 1) != 0) &&
             (mVar7 = archive_entry_mode(ae), ((mVar7 ^ mode) & 0x1ffU) != 0)) {
            mVar7 = archive_entry_mode(ae);
            failure_start(file,line,"Mode (%02o) and entry mode (%02o) mismatch",(ulong)(uint)mode,
                          (ulong)mVar7);
            failure_finish((void *)0x0);
            local_98 = L'\x01';
          }
          piVar12 = local_68;
          if ((int)uVar11 != 0) {
            iVar6 = *local_68;
            failure_start(file,line,
                          "Could not find match for ACL (type=%#010x,permset=%#010x,tag=%d,qual=%d,name=``%s\'\')"
                          ,(ulong)(uint)acls[iVar6].type,(ulong)(uint)acls[iVar6].permset,
                          (ulong)(uint)acls[iVar6].tag,(ulong)(uint)acls[iVar6].qual,
                          acls[iVar6].name);
            failure_finish((void *)0x0);
            local_98 = L'\x01';
          }
          free(piVar12);
          return local_98;
        }
        local_80 = uVar11;
        if (0 < (int)uVar11) {
          uVar14 = tag + L'\xffffd8ee';
          uVar8 = 0;
          local_38 = name;
          piVar12 = local_68;
          local_4c = qual;
          do {
            iVar6 = piVar12[uVar8];
            if (((acls[iVar6].type == wVar4) && (acls[iVar6].permset == wVar2)) &&
               (acls[iVar6].tag == wVar3)) {
              if (((uVar14 < 5) && ((0x15U >> (uVar14 & 0x1f) & 1) != 0)) || (wVar3 == L'❻')) {
LAB_00118589:
                piVar12[uVar8] = piVar12[(uVar11 & 0xffffffff) - 1];
                uVar11 = (ulong)((int)local_80 - 1);
                uVar14 = wVar4 ^ 0x100;
                if (wVar3 == L'✒' && uVar14 == 0) goto LAB_00118552;
                if (wVar3 == L'✔' && uVar14 == 0) goto LAB_00118616;
                ae = local_78;
                if (uVar14 == 0 && wVar3 == L'✖') goto LAB_00118689;
                goto LAB_001183ed;
              }
              if (acls[iVar6].qual == local_4c) {
                pcVar10 = acls[iVar6].name;
                if (local_38 == (char *)0x0) {
                  if (pcVar10 == (char *)0x0) goto LAB_00118589;
                  cVar1 = *pcVar10;
                }
                else {
                  if (pcVar10 != (char *)0x0) {
                    local_50 = uVar14;
                    iVar6 = strcmp(local_38,pcVar10);
                    piVar12 = local_68;
                    uVar14 = local_50;
                    if (iVar6 == 0) goto LAB_00118589;
                    goto LAB_00118502;
                  }
                  cVar1 = *local_38;
                }
                if (cVar1 == '\0') goto LAB_00118589;
              }
            }
LAB_00118502:
            uVar8 = uVar8 + 1;
          } while (uVar8 < (uVar11 & 0xffffffff));
        }
        ae = local_78;
        uVar14 = wVar4 ^ 0x100;
        if (wVar3 == L'✒' && uVar14 == 0) goto code_r0x00118527;
        if (wVar3 != L'✔' || uVar14 != 0) {
          if (uVar14 != 0 || wVar3 != L'✖') {
            failure_start(file,line,
                          "Could not find match for ACL (type=%#010x,permset=%#010x,tag=%d,qual=%d,name=``%s\'\')"
                          ,(ulong)(uint)wVar4,(ulong)(uint)permset,(ulong)(uint)wVar3,
                          (ulong)(uint)qual,name);
            uVar11 = local_80;
            goto LAB_001186f0;
          }
          failure_start(file,line,"No match for other perm");
          failure_finish((void *)0x0);
          local_98 = L'\x01';
          uVar11 = local_80;
LAB_00118689:
          uVar8 = (ulong)(uint)permset;
          if (permset != local_70) {
            pcVar10 = "OTHER permset (%02o) != other mode (%02o)";
            uVar13 = (ulong)(uint)local_70;
            goto LAB_001186ac;
          }
          goto LAB_001183ed;
        }
        failure_start(file,line,"No match for group_obj perm");
        failure_finish((void *)0x0);
        local_98 = L'\x01';
        uVar11 = local_80;
LAB_00118616:
        uVar8 = (ulong)(uint)permset;
        ae = local_78;
        if (permset * 8 != local_58) {
          pcVar10 = "GROUP_OBJ permset (%02o) != group mode (%02o)";
          uVar13 = (ulong)local_60;
          goto LAB_001186ac;
        }
      } while( true );
    }
  }
  failure_start(file,line,"No ACL\'s to compare, type mask: %d",(ulong)(uint)want_type);
  return L'\x01';
code_r0x00118527:
  failure_start(file,line,"No match for user_obj perm");
  failure_finish((void *)0x0);
  local_98 = L'\x01';
  uVar11 = local_80;
LAB_00118552:
  uVar8 = (ulong)(uint)permset;
  ae = local_78;
  if (permset << 6 != local_54) {
    pcVar10 = "USER_OBJ permset (%02o) != user mode (%02o)";
    uVar13 = (ulong)local_5c;
LAB_001186ac:
    failure_start(file,line,pcVar10,uVar8,uVar13);
LAB_001186f0:
    failure_finish((void *)0x0);
    local_98 = L'\x01';
  }
  goto LAB_001183ed;
}

Assistant:

int
assertion_entry_compare_acls(const char *file, int line,
    struct archive_entry *ae, struct archive_test_acl_t *acls, int cnt,
    int want_type, int mode)
{
	int *marker;
	int i, r, n, ret;
	int type, permset, tag, qual;
	int matched;
	const char *name;

	assertion_count(file, line);

	ret = 0;
	n = 0;
	marker = malloc(sizeof(marker[0]) * cnt);

	for (i = 0; i < cnt; i++) {
		if ((acls[i].type & want_type) != 0) {
			marker[n] = i;
			n++;
		}
	}

	if (n == 0) {
		failure_start(file, line, "No ACL's to compare, type mask: %d",
		    want_type);
		return (1);
	}

	while (0 == (r = archive_entry_acl_next(ae, want_type,
			 &type, &permset, &tag, &qual, &name))) {
		for (i = 0, matched = 0; i < n && !matched; i++) {
			if (archive_test_acl_match(&acls[marker[i]], type,
			    permset, tag, qual, name)) {
				/* We found a match; remove it. */
				marker[i] = marker[n - 1];
				n--;
				matched = 1;
			}
		}
		if (type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS
		    && tag == ARCHIVE_ENTRY_ACL_USER_OBJ) {
			if (!matched) {
				failure_start(file, line, "No match for "
				    "user_obj perm");
				failure_finish(NULL);
				ret = 1;
			}
			if ((permset << 6) != (mode & 0700)) {
				failure_start(file, line, "USER_OBJ permset "
				    "(%02o) != user mode (%02o)",
				    (unsigned int)permset,
				    (unsigned int)(07 & (mode >> 6)));
				failure_finish(NULL);
				ret = 1;
			}
		} else if (type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS
		    && tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ) {
			if (!matched) {
				failure_start(file, line, "No match for "
				    "group_obj perm");
				failure_finish(NULL);
				ret = 1;
			}
			if ((permset << 3) != (mode & 0070)) {
				failure_start(file, line, "GROUP_OBJ permset "
				    "(%02o) != group mode (%02o)",
				    (unsigned int)permset,
				    (unsigned int)(07 & (mode >> 3)));
				failure_finish(NULL);
				ret = 1;
			}
		} else if (type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS
		    && tag == ARCHIVE_ENTRY_ACL_OTHER) {
			if (!matched) {
				failure_start(file, line, "No match for "
				    "other perm");
				failure_finish(NULL);
				ret = 1;
			}
			if ((permset << 0) != (mode & 0007)) {
				failure_start(file, line, "OTHER permset "
				    "(%02o) != other mode (%02o)",
				    (unsigned int)permset,
				    (unsigned int)mode & 07);
				failure_finish(NULL);
				ret = 1;
			}
		} else if (matched != 1) {
			failure_start(file, line, "Could not find match for "
			    "ACL (type=%#010x,permset=%#010x,tag=%d,qual=%d,"
			    "name=``%s'')", (unsigned int)type,
			    (unsigned int)permset, tag, qual, name);
			failure_finish(NULL);
			ret = 1;
		}
	}
	if (r != ARCHIVE_EOF) {
		failure_start(file, line, "Should not exit before EOF");
		failure_finish(NULL);
		ret = 1;
	}
	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0 &&
	    (mode_t)(mode & 0777) != (archive_entry_mode(ae) & 0777)) {
		failure_start(file, line, "Mode (%02o) and entry mode (%02o) "
		    "mismatch", (unsigned int)mode,
		    (unsigned int)archive_entry_mode(ae));
		failure_finish(NULL);
		ret = 1;
	}
	if (n != 0) {
		failure_start(file, line, "Could not find match for ACL "
		    "(type=%#010x,permset=%#010x,tag=%d,qual=%d,name=``%s'')",
		    (unsigned int)acls[marker[0]].type,
		    (unsigned int)acls[marker[0]].permset,
		    acls[marker[0]].tag, acls[marker[0]].qual,
		    acls[marker[0]].name);
		failure_finish(NULL);
		ret = 1;
		/* Number of ACLs not matched should == 0 */
	}
	free(marker);
	return (ret);
}